

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O2

int av1_calc_refresh_idx_for_intnl_arf
              (AV1_COMP *cpi,RefFrameMapPair *ref_frame_map_pairs,int gf_index)

{
  AV1_PRIMARY *pAVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = get_free_ref_map_index(ref_frame_map_pairs);
  if (iVar2 != -1) {
    return iVar2;
  }
  pAVar1 = cpi->ppi;
  uVar3 = is_one_pass_rt_params(cpi);
  iVar2 = get_refresh_idx(ref_frame_map_pairs,0,&pAVar1->gf_group,gf_index,uVar3 ^ 1,
                          (pAVar1->gf_group).display_idx[gf_index]);
  return iVar2;
}

Assistant:

int av1_calc_refresh_idx_for_intnl_arf(
    AV1_COMP *cpi, RefFrameMapPair ref_frame_map_pairs[REF_FRAMES],
    int gf_index) {
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;

  // Search for the open slot to store the current frame.
  int free_fb_index = get_free_ref_map_index(ref_frame_map_pairs);

  // Use a free slot if available.
  if (free_fb_index != INVALID_IDX) {
    return free_fb_index;
  } else {
    int enable_refresh_skip = !is_one_pass_rt_params(cpi);
    int refresh_idx =
        get_refresh_idx(ref_frame_map_pairs, 0, gf_group, gf_index,
                        enable_refresh_skip, gf_group->display_idx[gf_index]);
    return refresh_idx;
  }
}